

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

U32 ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr,int optLevel)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  if (optPtr->priceType == zop_predef) {
    uVar3 = litLength + 1;
    if (optLevel == 0) {
      if (uVar3 != 0) {
        iVar2 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        return iVar2 << 8;
      }
    }
    else if (uVar3 != 0) {
      uVar4 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      if (0x16 < uVar4) {
LAB_0016f640:
        __assert_fail("hb + BITCOST_ACCURACY < 31",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x45cb,"U32 ZSTD_fracWeight(U32)");
      }
      iVar2 = uVar4 << 8;
      uVar4 = uVar3 * 0x100 >> ((byte)uVar4 & 0x1f);
      goto LAB_0016f61b;
    }
LAB_0016f621:
    __assert_fail("val != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x12c2,"U32 ZSTD_highbit32(U32)");
  }
  if (litLength < 0x40) {
    uVar3 = (uint)(byte)ZSTD_LLcode(unsigned_int)::LL_Code[litLength];
  }
  else {
    uVar3 = 0x1f;
    if (litLength != 0) {
      for (; litLength >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = (uVar3 ^ 0xffffffe0) + 0x33;
  }
  uVar4 = LL_bits[uVar3] * 0x100 + optPtr->litLengthSumBasePrice;
  uVar3 = optPtr->litLengthFreq[uVar3] + 1;
  if (optLevel == 0) {
    if (uVar3 == 0) goto LAB_0016f621;
    uVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar2 = (uVar1 ^ 0x1f) * 0x100 + -0x1f00;
  }
  else {
    if (uVar3 == 0) goto LAB_0016f621;
    uVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    if (0x16 < uVar1) goto LAB_0016f640;
    iVar2 = -((uVar3 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100);
  }
LAB_0016f61b:
  return uVar4 + iVar2;
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr, int optLevel)
{
    if (optPtr->priceType == zop_predef) return WEIGHT(litLength, optLevel);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] * BITCOST_MULTIPLIER)
             + optPtr->litLengthSumBasePrice
             - WEIGHT(optPtr->litLengthFreq[llCode], optLevel);
    }
}